

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-fixed-contact-dynamical-system.cpp
# Opt level: O2

void __thiscall
stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
IMUFixedContactDynamicalSystem(IMUFixedContactDynamicalSystem *this,double dt)

{
  Matrix<double,_4,_1,_0,_4,_1> local_38;
  
  DynamicalSystemFunctorBase::DynamicalSystemFunctorBase(&this->super_DynamicalSystemFunctorBase);
  (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
       (_func_int **)&PTR__IMUFixedContactDynamicalSystem_002607d0;
  AccelerometerGyrometer::AccelerometerGyrometer(&this->sensor_);
  this->processNoise_ = (NoiseBase *)0x0;
  this->dt_ = dt;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  *(undefined4 *)
   (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage
   .m_data.array =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1]._0_4_;
  *(undefined4 *)
   ((long)(this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.
          m_storage.m_data.array + 4) =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1]._4_4_;
  *(undefined4 *)
   ((this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.
    m_storage.m_data.array + 1) =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1]._0_4_;
  *(undefined4 *)
   ((long)(this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.
          m_storage.m_data.array + 0xc) =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1]._4_4_;
  *(undefined4 *)
   ((this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.
    m_storage.m_data.array + 2) =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1]._0_4_;
  *(undefined4 *)
   ((long)(this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.
          m_storage.m_data.array + 0x14) =
       local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1]._4_4_;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       1.0;
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,1,2,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
            (&(this->quaternion_).m_coeffs,&local_38);
  this->measurementSize_ = 6;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IMUFixedContactDynamicalSystem::
                    IMUFixedContactDynamicalSystem(double dt):
        processNoise_(0x0), dt_(dt),orientationVector_(Vector3::Zero()),
        quaternion_(Quaternion::Identity()),
        measurementSize_(measurementSizeBase_)
    {
#ifdef STATEOBSERVATION_VERBOUS_CONSTRUCTORS
     std::cout<<std::endl<<"IMUFixedContactDynamicalSystem Constructor"<<std::endl;
#endif //STATEOBSERVATION_VERBOUS_CONSTRUCTOR
    }